

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.h
# Opt level: O2

void __thiscall TadsMessageQueue::~TadsMessageQueue(TadsMessageQueue *this)

{
  OS_Counter *pOVar1;
  OS_Mutex *pOVar2;
  OS_Event *pOVar3;
  
  (this->super_CVmRefCntObj)._vptr_CVmRefCntObj = (_func_int **)&PTR__TadsMessageQueue_003431a8;
  flush(this);
  pOVar2 = this->mu;
  LOCK();
  pOVar1 = &(pOVar2->super_CVmRefCntObj).cnt;
  (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + -1;
  UNLOCK();
  if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
    (*(pOVar2->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])();
  }
  pOVar3 = this->ev;
  LOCK();
  pOVar1 = &(pOVar3->super_CVmRefCntObj).cnt;
  (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + -1;
  UNLOCK();
  if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
    (*(pOVar3->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])();
  }
  pOVar3 = this->quit_evt;
  if (pOVar3 != (OS_Event *)0x0) {
    LOCK();
    pOVar1 = &(pOVar3->super_CVmRefCntObj).cnt;
    (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + -1
    ;
    UNLOCK();
    if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
      (*(pOVar3->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])();
      return;
    }
  }
  return;
}

Assistant:

~TadsMessageQueue()
    {
        /* discard any messages still in the queue */
        flush();

        /* destroy our synchronization resources */
        mu->release_ref();
        ev->release_ref();
        if (quit_evt != 0)
            quit_evt->release_ref();
    }